

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::DynamicMapField::InsertOrLookupMapValue
          (DynamicMapField *this,MapKey *map_key,MapValueRef *val)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  MapValueConstRef *other;
  pointer pvVar3;
  MapValueRef *map_val;
  undefined1 local_48 [8];
  iterator iter;
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *map;
  MapValueRef *val_local;
  MapKey *map_key_local;
  DynamicMapField *this_local;
  
  iVar2 = (*(this->
            super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
            super_MapFieldBase._vptr_MapFieldBase[0x16])();
  iter.it_.bucket_index_ = CONCAT44(extraout_var,iVar2);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::find<google::protobuf::MapKey>
            ((iterator *)local_48,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)iter.it_.bucket_index_,
             map_key);
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::end
            ((iterator *)&map_val,
             (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)iter.it_.bucket_index_)
  ;
  bVar1 = protobuf::operator==((iterator *)local_48,(iterator *)&map_val);
  if (bVar1) {
    other = &Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
             operator[]<google::protobuf::MapKey>(&this->map_,map_key)->super_MapValueConstRef;
    AllocateMapValue(this,(MapValueRef *)other);
    MapValueConstRef::CopyFrom(&val->super_MapValueConstRef,other);
  }
  else {
    pvVar3 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::iterator::operator->
                       ((iterator *)local_48);
    MapValueConstRef::CopyFrom(&val->super_MapValueConstRef,(MapValueConstRef *)(pvVar3 + 0x28));
  }
  return bVar1;
}

Assistant:

bool DynamicMapField::InsertOrLookupMapValue(const MapKey& map_key,
                                             MapValueRef* val) {
  // Always use mutable map because users may change the map value by
  // MapValueRef.
  Map<MapKey, MapValueRef>* map = MutableMap();
  Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
  if (iter == map->end()) {
    MapValueRef& map_val = map_[map_key];
    AllocateMapValue(&map_val);
    val->CopyFrom(map_val);
    return true;
  }
  // map_key is already in the map. Make sure (*map)[map_key] is not called.
  // [] may reorder the map and iterators.
  val->CopyFrom(iter->second);
  return false;
}